

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

int __thiscall libwebvtt::LineReader::GetLine(LineReader *this,string *line_ptr)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char local_31;
  int e;
  char c;
  int e_1;
  char c_1;
  string *ln;
  string *line_ptr_local;
  LineReader *this_local;
  
  if (line_ptr == (string *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    _e_1 = line_ptr;
    ln = line_ptr;
    line_ptr_local = (string *)this;
    std::__cxx11::string::clear();
    while (e = (**(this->super_Reader)._vptr_Reader)(this,&c), this_local._4_4_ = e, -1 < e) {
      if (0 < e) {
        uVar1 = std::__cxx11::string::empty();
        return (uint)((uVar1 & 1) != 0);
      }
      if (c == '\n') {
        return 0;
      }
      if (c == '\r') {
        iVar2 = (**(this->super_Reader)._vptr_Reader)(this,&local_31);
        if (iVar2 < 0) {
          return iVar2;
        }
        if (0 < iVar2) {
          return 0;
        }
        if (local_31 != '\n') {
          (*(this->super_Reader)._vptr_Reader[3])(this,(ulong)(uint)(int)local_31);
        }
        return 0;
      }
      if ((c == -2) || (c == -1)) {
        return -1;
      }
      uVar3 = std::__cxx11::string::length();
      if (9999 < uVar3) {
        return -1;
      }
      std::__cxx11::string::push_back((char)_e_1);
    }
  }
  return this_local._4_4_;
}

Assistant:

int LineReader::GetLine(std::string* line_ptr) {
  if (line_ptr == NULL)
    return -1;

  std::string& ln = *line_ptr;
  ln.clear();

  // Consume characters from the stream, until we
  // reach end-of-line (or end-of-stream).

  // The WebVTT spec states that lines may be
  // terminated in any of these three ways:
  //  LF
  //  CR
  //  CR LF

  // We interrogate each character as we read it from the stream.
  // If we detect an end-of-line character, we consume the full
  // end-of-line indication, and we're done; otherwise, accumulate
  // the character and repeat.

  for (;;) {
    char c;
    const int e = GetChar(&c);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return (ln.empty()) ? 1 : 0;

    // We have a character, so we must first determine
    // whether we have reached end-of-line.

    if (c == kLF)
      return 0;  // handle the easy end-of-line case immediately

    if (c == kCR)
      break;  // handle the hard end-of-line case outside of loop

    if (c == '\xFE' || c == '\xFF')  // not UTF-8
      return -1;

    // To defend against pathological or malicious streams, we
    // cap the line length at some arbitrarily-large value:
    enum { kMaxLineLength = 10000 };  // arbitrary

    if (ln.length() >= kMaxLineLength)
      return -1;

    // We don't have an end-of-line character, so accumulate
    // the character in our line buffer.
    ln.push_back(c);
  }

  // We detected a CR.  We must interrogate the next character
  // in the stream, to determine whether we have a LF (which
  // would make it part of this same line).

  char c;
  const int e = GetChar(&c);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;

  // If next character in the stream is not a LF, return it
  // to the stream (because it's part of the next line).
  if (c != kLF)
    UngetChar(c);

  return 0;
}